

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

QProcessEnvironment QProcessEnvironmentPrivate::fromList(QStringList *list)

{
  undefined1 uVar1;
  QString *pQVar2;
  __off_t __length;
  QProcessEnvironmentPrivate *in_RDI;
  long in_FS_OFFSET;
  qsizetype pos;
  QProcessEnvironment *env;
  QString name;
  QString value;
  ConstIterator end;
  ConstIterator it;
  undefined4 in_stack_ffffffffffffff18;
  CaseSensitivity in_stack_ffffffffffffff1c;
  QList<QString> *in_stack_ffffffffffffff20;
  QString *in_stack_ffffffffffffff28;
  QProcessEnvironment *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff50;
  QSharedDataPointer<QProcessEnvironmentPrivate> this;
  QString local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  QChar local_22;
  QString *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  QChar ch;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  this.d.ptr = (totally_ordered_wrapper<QProcessEnvironmentPrivate_*>)
               (totally_ordered_wrapper<QProcessEnvironmentPrivate_*>)in_RDI;
  QProcessEnvironment::QProcessEnvironment(in_stack_ffffffffffffff30);
  local_10.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QString>::constBegin(in_stack_ffffffffffffff20);
  local_18.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<QString>::constEnd(in_stack_ffffffffffffff20);
  while( true ) {
    local_20 = local_18.i;
    uVar1 = QList<QString>::const_iterator::operator!=(&local_10,local_18);
    if (!(bool)uVar1) break;
    pQVar2 = QList<QString>::const_iterator::operator->(&local_10);
    ch.ucs = (char16_t)((ulong)pQVar2 >> 0x30);
    QChar::QChar<char16_t,_true>(&local_22,L'=');
    pQVar2 = (QString *)
             QString::indexOf(in_stack_ffffffffffffff28,ch,(qsizetype)in_stack_ffffffffffffff20,
                              in_stack_ffffffffffffff1c);
    if (0 < (long)pQVar2) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QString>::const_iterator::operator->(&local_10);
      QString::mid(pQVar2,(qsizetype)this.d.ptr,(qsizetype)in_RDI);
      local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QList<QString>::const_iterator::operator*(&local_10);
      in_stack_ffffffffffffff28 = &local_68;
      QString::QString((QString *)in_stack_ffffffffffffff20,
                       (QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QString::truncate(in_stack_ffffffffffffff28,(char *)pQVar2,__length);
      QProcessEnvironment::insert
                ((QProcessEnvironment *)this.d.ptr,(QString *)in_RDI,
                 (QString *)CONCAT17(uVar1,in_stack_ffffffffffffff50));
      QString::~QString((QString *)0x78e606);
      QString::~QString((QString *)0x78e613);
    }
    QList<QString>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QSharedDataPointer<QProcessEnvironmentPrivate>)
           (QSharedDataPointer<QProcessEnvironmentPrivate>)this.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QProcessEnvironment QProcessEnvironmentPrivate::fromList(const QStringList &list)
{
    QProcessEnvironment env;
    QStringList::ConstIterator it = list.constBegin(),
                              end = list.constEnd();
    for ( ; it != end; ++it) {
        const qsizetype pos = it->indexOf(u'=', 1);
        if (pos < 1)
            continue;

        QString value = it->mid(pos + 1);
        QString name = *it;
        name.truncate(pos);
        env.insert(name, value);
    }
    return env;
}